

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  undefined2 uVar1;
  int iVar2;
  wchar_t *__dest;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  undefined1 uVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  wchar_t buffer [78];
  undefined1 local_168 [312];
  
  __dest = *it;
  auVar10 = *(undefined1 (*) [16])this;
  iVar2 = *(int *)(this + 0x10);
  lVar7 = (long)iVar2;
  puVar6 = local_168 + lVar7 * 4;
  auVar8 = *(undefined1 (*) [16])this;
  if ((ulong)(*(ulong *)this < 100) <= *(ulong *)(this + 8)) {
    do {
      lVar5 = auVar10._8_8_;
      uVar4 = auVar10._0_8_;
      auVar10 = __udivti3(uVar4,lVar5,100,0);
      uVar1 = *(undefined2 *)(basic_data<void>::digits + (uVar4 + auVar10._0_8_ * -100) * 2);
      uVar9 = (undefined1)((ushort)uVar1 >> 8);
      auVar8 = ZEXT416(CONCAT22((short)(CONCAT13(uVar9,CONCAT12(uVar9,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar8 = pshuflw(auVar8,auVar8,0x60);
      *(ulong *)(puVar6 + -8) = CONCAT44(auVar8._4_4_ >> 0x18,auVar8._0_4_ >> 0x18);
      puVar6 = puVar6 + -8;
      auVar8 = auVar10;
    } while (lVar5 != 0 || (ulong)-lVar5 < (ulong)(9999 < uVar4));
  }
  if (auVar8._8_8_ == 0 && (ulong)(9 < auVar8._0_8_) <= (ulong)-auVar8._8_8_) {
    uVar3 = auVar8._0_4_ | 0x30;
    lVar5 = -4;
  }
  else {
    uVar4 = auVar8._0_8_ & 0xffffffff;
    *(int *)(puVar6 + -4) = (int)(char)basic_data<void>::digits[(uVar4 * 2 & 0xffffffff) + 1];
    uVar3 = (uint)(char)basic_data<void>::digits[uVar4 * 2];
    lVar5 = -8;
  }
  *(uint *)(puVar6 + lVar5) = uVar3;
  if (iVar2 != 0) {
    memcpy(__dest,local_168,lVar7 * 4);
  }
  *it = __dest + lVar7;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }